

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

int Fra_SmlNodeCountOnes(Fra_Sml_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  uint *puVar2;
  int local_28;
  int local_24;
  int Counter;
  int i;
  uint *pSims;
  Aig_Obj_t *pObj_local;
  Fra_Sml_t *p_local;
  
  local_28 = 0;
  puVar2 = Fra_ObjSim(p,pObj->Id);
  for (local_24 = 0; local_24 < p->nWordsTotal; local_24 = local_24 + 1) {
    iVar1 = Aig_WordCountOnes(puVar2[local_24]);
    local_28 = iVar1 + local_28;
  }
  return local_28;
}

Assistant:

int Fra_SmlNodeCountOnes( Fra_Sml_t * p, Aig_Obj_t * pObj )
{
    unsigned * pSims;
    int i, Counter = 0;
    pSims = Fra_ObjSim(p, pObj->Id);
    for ( i = 0; i < p->nWordsTotal; i++ )
        Counter += Aig_WordCountOnes( pSims[i] );
    return Counter;
}